

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

int Bmcg_ManPerformOne(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  bool bVar1;
  int iVar2;
  uint f;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Bmcg_Man_t *p;
  Cnf_Dat_t *pCnf;
  long lVar7;
  Abc_Cex_t *pAVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int nClauses;
  int nClauses_00;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int local_6c;
  timespec ts;
  abctime local_58;
  int local_48;
  int iLit;
  ulong local_40;
  Abc_Cex_t **local_38;
  
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p = Bmcg_ManStart(pGia,pPars);
  local_38 = &pGia->pCexSeq;
  Abc_CexFreeP(local_38);
  if (pPars->nFramesMax < 0) {
    local_6c = -1;
    uVar13 = 0;
    iVar2 = 0;
  }
  else {
    iVar3 = pPars->nFramesAdd;
    local_6c = -1;
    uVar12 = 0;
    iVar2 = 0;
    do {
      local_48 = (int)uVar12;
      pCnf = Bmcg_ManAddNewCnf(p,local_48,iVar3);
      if (pCnf == (Cnf_Dat_t *)0x0) {
        Bmcg_ManPrintFrame(p,local_48,nClauses,-1,local_58);
        iVar3 = pPars->nFramesAdd;
        if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
          if (iVar3 < 1) {
            iVar2 = 0;
          }
          else {
            iVar5 = pGia->nRegs;
            pVVar10 = pGia->vCos;
            iVar2 = 0;
            do {
              if (iVar5 < pVVar10->nSize) {
                iVar3 = 0;
                do {
                  (*pPars->pFuncOnFrameDone)(iVar2 + local_48,iVar3,0);
                  iVar3 = iVar3 + 1;
                  iVar5 = pGia->nRegs;
                  pVVar10 = pGia->vCos;
                } while (iVar3 < pVVar10->nSize - iVar5);
                iVar3 = pPars->nFramesAdd;
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 < iVar3);
          }
        }
      }
      else {
        Bmcg_ManAddCnf(p,p->pSats[0],pCnf);
        Cnf_DataFree(pCnf);
        iVar3 = pPars->nFramesAdd;
        iVar5 = pGia->nRegs;
        iVar9 = pGia->vCos->nSize;
        if (p->pFrames->vCos->nSize - p->pFrames->nRegs != (iVar9 - iVar5) * (iVar3 + local_48)) {
          __assert_fail("Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                        ,0x17a,"int Bmcg_ManPerformOne(Gia_Man_t *, Bmc_AndPar_t *)");
        }
        if (iVar3 < 1) {
          iVar2 = 0;
        }
        else {
          iVar2 = 0;
          local_40 = uVar12;
          do {
            if (iVar5 < iVar9) {
              f = iVar2 + (int)local_40;
              uVar13 = 0;
              do {
                iVar3 = clock_gettime(3,(timespec *)&ts);
                if (iVar3 < 0) {
                  lVar11 = 1;
                }
                else {
                  lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                uVar4 = (pGia->vCos->nSize - pGia->nRegs) * local_48 + uVar13;
                if ((int)uVar4 < 0) {
LAB_0057b749:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                pVVar10 = p->pFrames->vCos;
                if (pVVar10->nSize <= (int)uVar4) goto LAB_0057b749;
                iVar3 = pVVar10->pArray[uVar4];
                if (((long)iVar3 < 0) || (p->pFrames->nObjs <= iVar3)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((p->vFr2Sat).nSize <= iVar3) goto LAB_0057b749;
                iVar3 = (p->vFr2Sat).pArray[iVar3];
                if (iVar3 < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                iLit = iVar3 * 2;
                if (pPars->nTimeOut != 0) {
                  iVar3 = clock_gettime(3,(timespec *)&ts);
                  if (iVar3 < 0) {
                    lVar7 = -1;
                  }
                  else {
                    lVar7 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  if ((lVar7 - local_58) / 1000000 < (long)pPars->nTimeOut) goto LAB_0057b348;
LAB_0057b4e6:
                  iVar5 = pGia->nRegs;
                  iVar9 = pGia->vCos->nSize;
                  break;
                }
LAB_0057b348:
                iVar3 = bmcg_sat_solver_solve(p->pSats[0],&iLit,1);
                iVar5 = clock_gettime(3,(timespec *)&ts);
                if (iVar5 < 0) {
                  lVar7 = -1;
                }
                else {
                  lVar7 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                p->timeSat = p->timeSat + lVar7 + lVar11;
                if (iVar3 != -1) {
                  if (iVar3 == 1) {
                    pPars->iFrame = f;
                    pAVar8 = Bmcg_ManGenerateCex(p,uVar13,f,0);
                    *local_38 = pAVar8;
                    pPars->nFailOuts = pPars->nFailOuts + 1;
                    Bmcg_ManPrintFrame(p,f,nClauses_00,-1,local_58);
                    if (pPars->fNotVerbose == 0) {
                      uVar4 = pGia->vCos->nSize - pGia->nRegs;
                      uVar12 = (ulong)uVar4;
                      if (1 < uVar4) {
                        uVar12 = 0;
                        uVar6 = uVar4 - 1;
                        do {
                          uVar12 = (ulong)((int)uVar12 + 1);
                          bVar1 = 9 < uVar6;
                          uVar6 = uVar6 / 10;
                        } while (bVar1);
                      }
                      Abc_Print(uVar4,
                                "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  "
                                ,uVar12,(ulong)uVar13,(ulong)f,uVar12,(ulong)(uint)pPars->nFailOuts,
                                uVar12,(ulong)uVar4);
                      fflush(_stdout);
                    }
                    local_6c = 0;
                    if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
                      (*pPars->pFuncOnFrameDone)(f,uVar13,1);
                    }
                  }
                  goto LAB_0057b4e6;
                }
                if (uVar13 == ~pGia->nRegs + pGia->vCos->nSize) {
                  Bmcg_ManPrintFrame(p,f,(int)(lVar7 + lVar11),-1,local_58);
                }
                if (pPars->pFuncOnFrameDone != (_func_void_int_int_int *)0x0) {
                  (*pPars->pFuncOnFrameDone)(f,uVar13,0);
                }
                uVar13 = uVar13 + 1;
                iVar5 = pGia->nRegs;
                iVar9 = pGia->vCos->nSize;
              } while ((int)uVar13 < iVar9 - iVar5);
            }
            else {
              uVar13 = 0;
            }
            uVar12 = local_40;
            if ((int)uVar13 < iVar9 - iVar5) {
              iVar3 = pPars->nFramesAdd;
              break;
            }
            iVar3 = pPars->nFramesAdd;
            if (iVar2 + (int)local_40 == pPars->nFramesMax + -1) break;
            iVar2 = iVar2 + 1;
            local_48 = local_48 + 1;
          } while (iVar2 < iVar3);
        }
        uVar13 = (uint)uVar12;
        if (iVar2 < iVar3) break;
      }
      uVar13 = (int)uVar12 + iVar3;
      uVar12 = (ulong)uVar13;
    } while ((pPars->nFramesMax == 0) || ((int)uVar13 < pPars->nFramesMax));
  }
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeOth = lVar11 - (p->timeSat + p->timeCnf + p->timeSmp + p->timeUnf + local_58);
  if ((local_6c == -1) && (pPars->fNotVerbose == 0)) {
    iVar3 = iVar2 + 1;
    if (pPars->nFramesAdd <= iVar2) {
      iVar3 = 0;
    }
    printf("No output failed in %d frames.  ",(ulong)(iVar3 + uVar13));
  }
  iVar3 = 3;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar11 - local_58) / 1000000.0);
  Bmcg_ManPrintTime(p);
  Bmcg_ManStop(p);
  return local_6c;
}

Assistant:

int Bmcg_ManPerformOne( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime clkStart = Abc_Clock();
    Bmcg_Man_t * p = Bmcg_ManStart( pGia, pPars );
    int f, k = 0, i = Gia_ManPoNum(pGia), status, RetValue = -1, nClauses = 0;
    Abc_CexFreeP( &pGia->pCexSeq );
    for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f += pPars->nFramesAdd )
    {
        Cnf_Dat_t * pCnf = Bmcg_ManAddNewCnf( p, f, pPars->nFramesAdd );
        if ( pCnf == NULL )
        {
            Bmcg_ManPrintFrame( p, f, nClauses, -1, clkStart );
            if( pPars->pFuncOnFrameDone )
                for ( k = 0; k < pPars->nFramesAdd; k++ )
                for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
                    pPars->pFuncOnFrameDone(f+k, i, 0);
            continue;
        }
        nClauses += pCnf->nClauses;
        Bmcg_ManAddCnf( p, p->pSats[0], pCnf );
        Cnf_DataFree( pCnf );
        assert( Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia) );
        for ( k = 0; k < pPars->nFramesAdd; k++ )
        {
            for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
            {
                abctime clk = Abc_Clock();
                int iObj = Gia_ObjId( p->pFrames, Gia_ManCo(p->pFrames, (f+k) * Gia_ManPoNum(pGia) + i) );
                int iLit = Abc_Var2Lit( Vec_IntEntry(&p->vFr2Sat, iObj), 0 );
                if ( pPars->nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->nTimeOut )
                    break;
                status = bmcg_sat_solver_solve( p->pSats[0], &iLit, 1 );
                p->timeSat += Abc_Clock() - clk;
                if ( status == -1 ) // unsat
                {
                    if ( i == Gia_ManPoNum(pGia)-1 )
                        Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if( pPars->pFuncOnFrameDone)
                        pPars->pFuncOnFrameDone(f+k, i, 0);
                    continue;
                }
                if ( status == 1 ) // sat
                {
                    RetValue = 0;
                    pPars->iFrame = f+k;
                    pGia->pCexSeq = Bmcg_ManGenerateCex( p, i, f+k, 0 );
                    pPars->nFailOuts++;
                    Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if ( !pPars->fNotVerbose )
                    {
                        int nOutDigits = Abc_Base10Log( Gia_ManPoNum(pGia) );
                        Abc_Print( 1, "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",  
                            nOutDigits, i, f+k, nOutDigits, pPars->nFailOuts, nOutDigits, Gia_ManPoNum(pGia) );
                        fflush( stdout );
                    }
                    if( pPars->pFuncOnFrameDone )
                        pPars->pFuncOnFrameDone(f+k, i, 1);
                }
                break;
            }
            if ( i < Gia_ManPoNum(pGia) || f+k == pPars->nFramesMax-1 )
                break;
        }
        if ( k < pPars->nFramesAdd )
            break;
    }
    p->timeOth = Abc_Clock() - clkStart - p->timeUnf - p->timeCnf - p->timeSmp - p->timeSat;
    if ( RetValue == -1 && !pPars->fNotVerbose )
        printf( "No output failed in %d frames.  ", f + (k < pPars->nFramesAdd ? k+1 : 0) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Bmcg_ManPrintTime( p );
    Bmcg_ManStop( p );
    return RetValue;
}